

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 141_linkedListCycle.cpp
# Opt level: O2

int main(void)

{
  ListNode *head;
  
  head = (ListNode *)operator_new(0x10);
  head->val = 1;
  head->next = head;
  hasCycle(head);
  std::ostream::_M_insert<bool>(true);
  return 0;
}

Assistant:

int main()
{
	int x = 10;
	ListNode *head = new ListNode(x);//,*head2(x),*head3(0);
	head->val = 1;
	head->next = head;
	cout << hasCycle(head);
	return 0;
}